

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O2

void __thiscall
de::details::UniqueBase<vkt::pipeline::Image,_de::DefaultDeleter<vkt::pipeline::Image>_>::reset
          (UniqueBase<vkt::pipeline::Image,_de::DefaultDeleter<vkt::pipeline::Image>_> *this)

{
  Image *ptr;
  
  ptr = (this->m_data).ptr;
  if (ptr != (Image *)0x0) {
    DefaultDeleter<vkt::pipeline::Image>::operator()
              ((DefaultDeleter<vkt::pipeline::Image> *)&(this->m_data).field_0x8,ptr);
    (this->m_data).ptr = (Image *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}